

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::FileGenerator::GenerateSiblings
          (FileGenerator *this,string *package_dir,GeneratorContext *context,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *file_list,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *annotation_list)

{
  FileDescriptor *pFVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Context *pCVar6;
  EnumDescriptor *pEVar7;
  string *psVar8;
  scoped_ptr<google::protobuf::compiler::java::MessageGenerator> *psVar9;
  string *psVar10;
  GeneratorFactory *pGVar11;
  ServiceDescriptor *pSVar12;
  undefined4 extraout_var;
  allocator local_201;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_200;
  scoped_ptr<google::protobuf::compiler::java::ServiceGenerator> local_1e0;
  scoped_ptr<google::protobuf::compiler::java::ServiceGenerator> generator_2;
  int i_2;
  allocator local_1b9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  undefined8 local_198;
  undefined8 uStack_190;
  allocator local_181;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_180;
  int local_15c;
  code *pcStack_158;
  int i_1;
  undefined8 uStack_150;
  allocator local_141;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  undefined1 local_120 [8];
  EnumLiteGenerator generator_1;
  allocator local_b9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8 [2];
  undefined1 local_88 [8];
  EnumGenerator generator;
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *annotation_list_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *file_list_local;
  GeneratorContext *context_local;
  string *package_dir_local;
  FileGenerator *this_local;
  
  bVar2 = MultipleJavaFiles(this->file_,(bool)(this->immutable_api_ & 1));
  if (bVar2) {
    generator.name_resolver_._4_4_ = 0;
    while( true ) {
      iVar5 = generator.name_resolver_._4_4_;
      iVar4 = FileDescriptor::enum_type_count(this->file_);
      bVar2 = SUB81(annotation_list,0);
      if (iVar4 <= iVar5) break;
      pFVar1 = this->file_;
      pCVar6 = internal::scoped_ptr<google::protobuf::compiler::java::Context>::operator->
                         (&this->context_);
      bVar3 = Context::EnforceLite(pCVar6);
      bVar3 = HasDescriptorMethods(pFVar1,bVar3);
      if (bVar3) {
        pEVar7 = FileDescriptor::enum_type(this->file_,generator.name_resolver_._4_4_);
        bVar3 = this->immutable_api_;
        pCVar6 = internal::scoped_ptr<google::protobuf::compiler::java::Context>::get
                           (&this->context_);
        EnumGenerator::EnumGenerator((EnumGenerator *)local_88,pEVar7,(bool)(bVar3 & 1),pCVar6);
        psVar8 = (string *)FileDescriptor::enum_type(this->file_,generator.name_resolver_._4_4_);
        bVar3 = (this->options_).annotate_code;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_b8,"",&local_b9);
        generator_1.name_resolver_ = (ClassNameResolver *)EnumGenerator::Generate;
        GenerateSibling<google::protobuf::compiler::java::EnumGenerator,google::protobuf::EnumDescriptor>
                  ((java *)package_dir,&this->java_package_,psVar8,(EnumDescriptor *)context,
                   (GeneratorContext *)file_list,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(ulong)(bVar3 & 1),bVar2,local_b8,(string *)local_88,
                   (EnumGenerator *)EnumGenerator::Generate,0);
        std::__cxx11::string::~string((string *)local_b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_b9);
        EnumGenerator::~EnumGenerator((EnumGenerator *)local_88);
      }
      else {
        pEVar7 = FileDescriptor::enum_type(this->file_,generator.name_resolver_._4_4_);
        bVar3 = this->immutable_api_;
        pCVar6 = internal::scoped_ptr<google::protobuf::compiler::java::Context>::get
                           (&this->context_);
        EnumLiteGenerator::EnumLiteGenerator
                  ((EnumLiteGenerator *)local_120,pEVar7,(bool)(bVar3 & 1),pCVar6);
        psVar8 = (string *)FileDescriptor::enum_type(this->file_,generator.name_resolver_._4_4_);
        bVar3 = (this->options_).annotate_code;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_140,"",&local_141);
        pcStack_158 = EnumLiteGenerator::Generate;
        uStack_150 = 0;
        GenerateSibling<google::protobuf::compiler::java::EnumLiteGenerator,google::protobuf::EnumDescriptor>
                  ((java *)package_dir,&this->java_package_,psVar8,(EnumDescriptor *)context,
                   (GeneratorContext *)file_list,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(ulong)(bVar3 & 1),bVar2,&local_140,(string *)local_120,
                   (EnumLiteGenerator *)EnumLiteGenerator::Generate,0);
        std::__cxx11::string::~string((string *)&local_140);
        std::allocator<char>::~allocator((allocator<char> *)&local_141);
        EnumLiteGenerator::~EnumLiteGenerator((EnumLiteGenerator *)local_120);
      }
      generator.name_resolver_._4_4_ = generator.name_resolver_._4_4_ + 1;
    }
    for (local_15c = 0; iVar5 = local_15c, iVar4 = FileDescriptor::message_type_count(this->file_),
        iVar5 < iVar4; local_15c = local_15c + 1) {
      if ((this->immutable_api_ & 1U) != 0) {
        psVar8 = (string *)FileDescriptor::message_type(this->file_,local_15c);
        bVar3 = (this->options_).annotate_code;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_180,"OrBuilder",&local_181);
        psVar9 = internal::
                 scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>_>
                 ::operator[](&this->message_generators_,(long)local_15c);
        psVar10 = (string *)
                  internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>::get
                            (psVar9);
        uStack_190 = 0;
        local_198 = 0x29;
        GenerateSibling<google::protobuf::compiler::java::MessageGenerator,google::protobuf::Descriptor>
                  ((java *)package_dir,&this->java_package_,psVar8,(Descriptor *)context,
                   (GeneratorContext *)file_list,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(ulong)(bVar3 & 1),bVar2,&local_180,psVar10,(MessageGenerator *)0x29,0);
        std::__cxx11::string::~string((string *)&local_180);
        std::allocator<char>::~allocator((allocator<char> *)&local_181);
      }
      psVar8 = (string *)FileDescriptor::message_type(this->file_,local_15c);
      bVar3 = (this->options_).annotate_code;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1b8,"",&local_1b9);
      psVar9 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>_>
               ::operator[](&this->message_generators_,(long)local_15c);
      psVar10 = (string *)
                internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>::get
                          (psVar9);
      GenerateSibling<google::protobuf::compiler::java::MessageGenerator,google::protobuf::Descriptor>
                ((java *)package_dir,&this->java_package_,psVar8,(Descriptor *)context,
                 (GeneratorContext *)file_list,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(ulong)(bVar3 & 1),bVar2,&local_1b8,psVar10,(MessageGenerator *)0x21,0);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
    }
    pFVar1 = this->file_;
    pCVar6 = internal::scoped_ptr<google::protobuf::compiler::java::Context>::operator->
                       (&this->context_);
    bVar3 = Context::EnforceLite(pCVar6);
    bVar3 = HasGenericServices(pFVar1,bVar3);
    if (bVar3) {
      for (generator_2.ptr_._4_4_ = 0; iVar5 = generator_2.ptr_._4_4_,
          iVar4 = FileDescriptor::service_count(this->file_), iVar5 < iVar4;
          generator_2.ptr_._4_4_ = generator_2.ptr_._4_4_ + 1) {
        pGVar11 = internal::scoped_ptr<google::protobuf::compiler::java::GeneratorFactory>::
                  operator->(&this->generator_factory_);
        pSVar12 = FileDescriptor::service(this->file_,generator_2.ptr_._4_4_);
        iVar5 = (*pGVar11->_vptr_GeneratorFactory[4])(pGVar11,pSVar12);
        internal::scoped_ptr<google::protobuf::compiler::java::ServiceGenerator>::scoped_ptr
                  (&local_1e0,(ServiceGenerator *)CONCAT44(extraout_var,iVar5));
        psVar8 = (string *)FileDescriptor::service(this->file_,generator_2.ptr_._4_4_);
        bVar3 = (this->options_).annotate_code;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_200,"",&local_201);
        psVar10 = (string *)
                  internal::scoped_ptr<google::protobuf::compiler::java::ServiceGenerator>::get
                            (&local_1e0);
        GenerateSibling<google::protobuf::compiler::java::ServiceGenerator,google::protobuf::ServiceDescriptor>
                  ((java *)package_dir,&this->java_package_,psVar8,(ServiceDescriptor *)context,
                   (GeneratorContext *)file_list,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(ulong)(bVar3 & 1),bVar2,&local_200,psVar10,(ServiceGenerator *)0x11,0);
        std::__cxx11::string::~string((string *)&local_200);
        std::allocator<char>::~allocator((allocator<char> *)&local_201);
        internal::scoped_ptr<google::protobuf::compiler::java::ServiceGenerator>::~scoped_ptr
                  (&local_1e0);
      }
    }
  }
  return;
}

Assistant:

void FileGenerator::GenerateSiblings(const string& package_dir,
                                     GeneratorContext* context,
                                     std::vector<string>* file_list,
                                     std::vector<string>* annotation_list) {
  if (MultipleJavaFiles(file_, immutable_api_)) {
    for (int i = 0; i < file_->enum_type_count(); i++) {
      if (HasDescriptorMethods(file_, context_->EnforceLite())) {
        EnumGenerator generator(file_->enum_type(i), immutable_api_,
                                context_.get());
        GenerateSibling<EnumGenerator>(
            package_dir, java_package_, file_->enum_type(i), context, file_list,
            options_.annotate_code, annotation_list, "", &generator,
            &EnumGenerator::Generate);
      } else {
        EnumLiteGenerator generator(file_->enum_type(i), immutable_api_,
                                    context_.get());
        GenerateSibling<EnumLiteGenerator>(
            package_dir, java_package_, file_->enum_type(i), context, file_list,
            options_.annotate_code, annotation_list, "", &generator,
            &EnumLiteGenerator::Generate);
      }
    }
    for (int i = 0; i < file_->message_type_count(); i++) {
      if (immutable_api_) {
        GenerateSibling<MessageGenerator>(
            package_dir, java_package_, file_->message_type(i), context,
            file_list, options_.annotate_code, annotation_list, "OrBuilder",
            message_generators_[i].get(), &MessageGenerator::GenerateInterface);
      }
      GenerateSibling<MessageGenerator>(
          package_dir, java_package_, file_->message_type(i), context,
          file_list, options_.annotate_code, annotation_list, "",
          message_generators_[i].get(), &MessageGenerator::Generate);
    }
    if (HasGenericServices(file_, context_->EnforceLite())) {
      for (int i = 0; i < file_->service_count(); i++) {
        google::protobuf::scoped_ptr<ServiceGenerator> generator(
            generator_factory_->NewServiceGenerator(file_->service(i)));
        GenerateSibling<ServiceGenerator>(
            package_dir, java_package_, file_->service(i), context, file_list,
            options_.annotate_code, annotation_list, "", generator.get(),
            &ServiceGenerator::Generate);
      }
    }
  }
}